

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_173::FunctionOptimizer::create(FunctionOptimizer *this)

{
  long in_RSI;
  FunctionOptimizer *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::(anonymous_namespace)::FunctionOptimizer,wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>const&,wasm::SubTypes_const&,wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>const&,bool_const&>
            ((StructValuesMap<wasm::PossibleConstantValues> *)&stack0xffffffffffffffe0,
             *(SubTypes **)(in_RSI + 0x130),
             *(StructValuesMap<wasm::PossibleConstantValues> **)(in_RSI + 0x138),
             *(bool **)(in_RSI + 0x140));
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::FunctionOptimizer,std::default_delete<wasm::(anonymous_namespace)::FunctionOptimizer>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<wasm::(anonymous_namespace)::FunctionOptimizer,_std::default_delete<wasm::(anonymous_namespace)::FunctionOptimizer>_>
              *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<wasm::(anonymous_namespace)::FunctionOptimizer,_std::default_delete<wasm::(anonymous_namespace)::FunctionOptimizer>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::FunctionOptimizer,_std::default_delete<wasm::(anonymous_namespace)::FunctionOptimizer>_>
                 *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionOptimizer>(
      propagatedInfos, subTypes, rawNewInfos, refTest);
  }